

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hpke.cc
# Opt level: O2

int EVP_HPKE_CTX_export(EVP_HPKE_CTX *ctx,uint8_t *out,size_t secret_len,uint8_t *context,
                       size_t context_len)

{
  int iVar1;
  EVP_MD *md;
  undefined4 extraout_var;
  uint8_t suite_id [10];
  
  iVar1 = hpke_build_suite_id(ctx,suite_id);
  if (iVar1 == 0) {
    iVar1 = 0;
  }
  else {
    md = (EVP_MD *)(*ctx->kdf->hkdf_md_func)();
    iVar1 = EVP_MD_size(md);
    iVar1 = hpke_labeled_expand((EVP_MD *)md,out,secret_len,ctx->exporter_secret,
                                CONCAT44(extraout_var,iVar1),suite_id,10,"sec",context,context_len);
  }
  return iVar1;
}

Assistant:

int EVP_HPKE_CTX_export(const EVP_HPKE_CTX *ctx, uint8_t *out,
                        size_t secret_len, const uint8_t *context,
                        size_t context_len) {
  uint8_t suite_id[HPKE_SUITE_ID_LEN];
  if (!hpke_build_suite_id(ctx, suite_id)) {
    return 0;
  }
  const EVP_MD *hkdf_md = ctx->kdf->hkdf_md_func();
  if (!hpke_labeled_expand(hkdf_md, out, secret_len, ctx->exporter_secret,
                           EVP_MD_size(hkdf_md), suite_id, sizeof(suite_id),
                           "sec", context, context_len)) {
    return 0;
  }
  return 1;
}